

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void custom_format<int>(char *format_str,int *args)

{
  size_t sVar1;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  ulong local_238 [2];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_228;
  
  local_238[0] = (ulong)(uint)*args;
  sVar1 = strlen(format_str);
  local_228.super_basic_buffer<char>.ptr_ = local_228.store_;
  local_228.super_basic_buffer<char>.size_ = 0;
  local_228.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_00264c28;
  local_228.super_basic_buffer<char>.capacity_ = 500;
  format_str_00.size_ = sVar1;
  format_str_00.data_ = format_str;
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_238;
  args_00.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  fmt::v5::
  vformat_to<mock_arg_formatter,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_228,format_str_00,args_00,(locale_ref)0x0);
  fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(&local_228)
  ;
  return;
}

Assistant:

void custom_format(const char *format_str, const Args & ... args) {
  auto va = fmt::make_format_args(args...);
  return custom_vformat(format_str, va);
}